

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result * __thiscall
unodb::detail::
basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::begin(iter_result *__return_storage_ptr__,
       basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this)

{
  uintptr_t uVar1;
  uint64_t i;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x100) {
      cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0xaa8,"begin");
    }
    if ((this->children)._M_elems[lVar2].value.tagged_ptr != 0) break;
    lVar2 = lVar2 + 1;
  }
  uVar1 = basic_node_ptr<unodb::detail::node_header>::tag_ptr((node_header *)this,I256);
  (__return_storage_ptr__->node).tagged_ptr = uVar1;
  __return_storage_ptr__->key_byte = (byte)lVar2;
  __return_storage_ptr__->child_index = (byte)lVar2;
  (__return_storage_ptr__->prefix).f =
       (inode_fields)
       (this->
       super_basic_inode_256_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       ).
       super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       .k_prefix;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_256::iter_result
  begin() noexcept {
    for (std::uint64_t i = 0; i < basic_inode_256::capacity; i++) {
      if (children[i] != nullptr) {
        const auto key = static_cast<std::byte>(i);  // child_index is key byte
        const auto child_index = static_cast<std::uint8_t>(i);
        return {node_ptr{this, node_type::I256}, key, child_index,
                this->get_key_prefix().get_snapshot()};
      }
    }
    // because we always have at least 49 keys.
    UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
  }